

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Operator::UpdateAttack(Operator *this,Chip *chip)

{
  char cVar1;
  Bit8u val;
  Bit8u rate;
  Chip *chip_local;
  Operator *this_local;
  
  cVar1 = (char)((int)(uint)this->reg60 >> 4);
  if (cVar1 == '\0') {
    this->attackAdd = 0;
    this->rateZero = this->rateZero | 0x10;
  }
  else {
    this->attackAdd = chip->attackRates[(byte)(cVar1 * '\x04' + this->ksr)];
    this->rateZero = this->rateZero & 0xef;
  }
  return;
}

Assistant:

inline void Operator::UpdateAttack( const Chip* chip ) {
	Bit8u rate = reg60 >> 4;
	if ( rate ) {
		Bit8u val = (rate << 2) + ksr;
		attackAdd = chip->attackRates[ val ];
		rateZero &= ~(1 << ATTACK);
	} else {
		attackAdd = 0;
		rateZero |= (1 << ATTACK);
	}
}